

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleset.cpp
# Opt level: O2

bool __thiscall
Ruleset::containsType(Ruleset *this,vector<Card,_std::allocator<Card>_> *cards,Card *card)

{
  pointer pCVar1;
  bool bVar2;
  Suit SVar3;
  Suit SVar4;
  pointer pCVar5;
  Card c;
  Card local_38;
  
  bVar2 = isTrump(this,card);
  if (bVar2) {
    bVar2 = containsTrump(this,cards);
    return bVar2;
  }
  pCVar5 = (cards->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pCVar1 = (cards->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  do {
    if (pCVar5 == pCVar1) {
      return false;
    }
    local_38 = *pCVar5;
    bVar2 = isTrump(this,&local_38);
    if (!bVar2) {
      SVar3 = Card::suit(&local_38);
      SVar4 = Card::suit(card);
      if (SVar3 == SVar4) {
        return true;
      }
    }
    pCVar5 = pCVar5 + 1;
  } while( true );
}

Assistant:

bool Ruleset::containsType(const std::vector<Card> &cards, const Card &card) {
    if (isTrump(card))
        return containsTrump(cards);
    for (Card c: cards)
        if (!isTrump(c) && c.suit() == card.suit())
            return true;
    return false;
}